

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_annotation.c
# Opt level: O3

HPDF_STATUS HPDF_Annot_SetGrayColor(HPDF_Annotation annot,HPDF_REAL color)

{
  HPDF_Array array;
  HPDF_STATUS HVar1;
  HPDF_STATUS HVar2;
  
  array = HPDF_Array_New(annot->mmgr);
  if (array != (HPDF_Array)0x0) {
    HVar1 = HPDF_Dict_Add(annot,"C",array);
    HVar2 = HPDF_Array_AddReal(array,color);
    if (HVar2 + HVar1 == 0) {
      return 0;
    }
  }
  HVar1 = HPDF_Error_GetCode(annot->error);
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Annot_SetGrayColor (HPDF_Annotation annot, HPDF_REAL color)
{
    HPDF_Array cArray;
    HPDF_STATUS ret = HPDF_OK;

    HPDF_PTRACE((" HPDF_Annot_SetGrayColor\n"));

    cArray = HPDF_Array_New (annot->mmgr);
    if (!cArray)
        return HPDF_Error_GetCode ( annot->error);

    ret += HPDF_Dict_Add (annot, "C", cArray);
    ret += HPDF_Array_AddReal ( cArray, color);

    if (ret != HPDF_OK)
        return HPDF_Error_GetCode ( annot->error);

    return HPDF_OK;
}